

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O0

bool __thiscall QThreadPool::contains(QThreadPool *this,QThread *thread)

{
  long lVar1;
  QThreadPoolThread *pQVar2;
  long in_FS_OFFSET;
  QThreadPoolThread *poolThread;
  QThreadPoolPrivate *d;
  QMutexLocker<QMutex> locker;
  QMutex *in_stack_ffffffffffffff98;
  QMutexLocker<QMutex> *in_stack_ffffffffffffffa0;
  undefined1 local_21;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QThreadPool *)0x6ccc2a);
  pQVar2 = qobject_cast<QThreadPoolThread_const*>((QObject *)0x6ccc39);
  if (pQVar2 == (QThreadPoolThread *)0x0) {
    local_21 = false;
  }
  else {
    QMutexLocker<QMutex>::QMutexLocker(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_21 = QSet<QThreadPoolThread_*>::contains
                         ((QSet<QThreadPoolThread_*> *)in_stack_ffffffffffffffa0,
                          (QThreadPoolThread **)in_stack_ffffffffffffff98);
    QMutexLocker<QMutex>::~QMutexLocker(in_stack_ffffffffffffffa0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

bool QThreadPool::contains(const QThread *thread) const
{
    Q_D(const QThreadPool);
    const QThreadPoolThread *poolThread = qobject_cast<const QThreadPoolThread *>(thread);
    if (!poolThread)
        return false;
    QMutexLocker locker(&d->mutex);
    return d->allThreads.contains(const_cast<QThreadPoolThread *>(poolThread));
}